

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O2

char * getobjname(Proto *p,int lastpc,int reg,char **name)

{
  long lVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  
LAB_00107e9f:
  pcVar4 = luaF_getlocalname(p,reg + 1,lastpc);
  *name = pcVar4;
  if (pcVar4 != (char *)0x0) {
    return "local";
  }
  uVar5 = 0;
  uVar6 = 0;
  if (0 < lastpc) {
    uVar6 = (ulong)(uint)lastpc;
  }
  iVar3 = 0;
  uVar8 = 0xffffffff;
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    uVar7 = p->code[uVar5];
    uVar11 = uVar7 & 0x3f;
    uVar10 = uVar7 >> 6 & 0xff;
    if (uVar11 - 0x24 < 2) {
LAB_00107f4e:
      if ((int)uVar10 <= reg) {
LAB_00107f64:
        uVar8 = 0xffffffff;
        if ((long)iVar3 <= (long)uVar5) {
          uVar8 = uVar5 & 0xffffffff;
        }
      }
    }
    else {
      if (uVar11 == 0x29) {
        uVar10 = uVar10 + 2;
        goto LAB_00107f4e;
      }
      if (uVar11 != 0x1e) {
        if (uVar11 == 4) {
          if (((int)uVar10 <= reg) && ((uint)reg <= uVar10 + (uVar7 >> 0x17))) goto LAB_00107f64;
          goto LAB_00107f6e;
        }
        if ((uVar10 != reg) || ((luaP_opmodes[uVar11] & 0x40) == 0)) goto LAB_00107f6e;
        goto LAB_00107f64;
      }
      iVar9 = (int)uVar5 + (uVar7 >> 0xe) + -0x1fffe;
      iVar2 = iVar3;
      if (iVar3 < iVar9) {
        iVar2 = iVar9;
      }
      if ((long)iVar9 <= (long)uVar5) {
        iVar2 = iVar3;
      }
      if (iVar9 <= lastpc) {
        iVar3 = iVar2;
      }
    }
LAB_00107f6e:
  }
  lastpc = (int)uVar8;
  if (lastpc == 0xffffffff) {
    return (char *)0x0;
  }
  uVar7 = p->code[lastpc];
  switch(uVar7 & 0x3f) {
  case 0:
    goto switchD_00107fa5_caseD_0;
  case 1:
    uVar7 = uVar7 >> 0xe;
    break;
  case 2:
    uVar7 = p->code[(long)lastpc + 1] >> 6;
    break;
  default:
    goto switchD_00107fa5_caseD_3;
  case 5:
    lVar1 = *(long *)((long)&p->upvalues->name + (ulong)(uVar7 >> 0x13 & 0xfffffff0));
    pcVar4 = "?";
    if (lVar1 != 0) {
      pcVar4 = (char *)(lVar1 + 0x18);
    }
    *name = pcVar4;
    return "upvalue";
  case 6:
  case 7:
    if ((uVar7 & 0x3f) == 7) {
      pcVar4 = luaF_getlocalname(p,(uVar7 >> 0x17) + 1,lastpc);
    }
    else {
      lVar1 = *(long *)((long)&p->upvalues->name + (ulong)((uVar7 >> 0x17) << 4));
      pcVar4 = "?";
      if (lVar1 != 0) {
        pcVar4 = (char *)(lVar1 + 0x18);
      }
    }
    kname(p,lastpc,uVar7 >> 0xe & 0x1ff,name);
    if (pcVar4 == (char *)0x0) {
      return "field";
    }
    iVar3 = strcmp(pcVar4,"_ENV");
    if (iVar3 != 0) {
      return "field";
    }
    return "global";
  case 0xc:
    kname(p,lastpc,uVar7 >> 0xe & 0x1ff,name);
    return "method";
  }
  if ((*(uint *)((long)&p->k->tt_ + (ulong)(uVar7 << 4)) & 0xf) == 4) {
    *name = (char *)(*(long *)((long)&p->k->value_ + (ulong)(uVar7 << 4)) + 0x18);
    return "constant";
  }
  return (char *)0x0;
switchD_00107fa5_caseD_0:
  reg = uVar7 >> 0x17;
  if ((uVar7 >> 6 & 0xff) <= (uint)reg) {
switchD_00107fa5_caseD_3:
    return (char *)0x0;
  }
  goto LAB_00107e9f;
}

Assistant:

static const char *getobjname (Proto *p, int lastpc, int reg,
                               const char **name) {
  int pc;
  *name = luaF_getlocalname(p, reg + 1, lastpc);
  if (*name)  /* is a local? */
    return "local";
  /* else try symbolic execution */
  pc = findsetreg(p, lastpc, reg);
  if (pc != -1) {  /* could find instruction? */
    Instruction i = p->code[pc];
    OpCode op = GET_OPCODE(i);
    switch (op) {
      case OP_MOVE: {
        int b = GETARG_B(i);  /* move from 'b' to 'a' */
        if (b < GETARG_A(i))
          return getobjname(p, pc, b, name);  /* get name for 'b' */
        break;
      }
      case OP_GETTABUP:
      case OP_GETTABLE: {
        int k = GETARG_C(i);  /* key index */
        int t = GETARG_B(i);  /* table index */
        const char *vn = (op == OP_GETTABLE)  /* name of indexed variable */
                         ? luaF_getlocalname(p, t + 1, pc)
                         : upvalname(p, t);
        kname(p, pc, k, name);
        return (vn && strcmp(vn, LUA_ENV) == 0) ? "global" : "field";
      }
      case OP_GETUPVAL: {
        *name = upvalname(p, GETARG_B(i));
        return "upvalue";
      }
      case OP_LOADK:
      case OP_LOADKX: {
        int b = (op == OP_LOADK) ? GETARG_Bx(i)
                                 : GETARG_Ax(p->code[pc + 1]);
        if (ttisstring(&p->k[b])) {
          *name = svalue(&p->k[b]);
          return "constant";
        }
        break;
      }
      case OP_SELF: {
        int k = GETARG_C(i);  /* key index */
        kname(p, pc, k, name);
        return "method";
      }
      default: break;  /* go through to return NULL */
    }
  }
  return NULL;  /* could not find reasonable name */
}